

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

word Nf_MatchRef_rec(Nf_Man_t *p,int i,int c,Nf_Mat_t *pM,int Required,Vec_Int_t *vBackup)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Nf_Mat_t *pNVar4;
  int *piVar5;
  int *piVar6;
  word wVar7;
  Mio_Cell2_t *pMVar8;
  int *pCut;
  int fCompl;
  int iVar;
  int k;
  int ReqFanin;
  word Area;
  Vec_Int_t *vBackup_local;
  int Required_local;
  Nf_Mat_t *pM_local;
  int c_local;
  int i_local;
  Nf_Man_t *p_local;
  
  _k = 0;
  if (-1 < *(int *)pM) {
    __assert_fail("pM->fBest",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                  ,0x6b9,"word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, int, Vec_Int_t *)")
    ;
  }
  if (pM->D <= Required) {
    if ((*(uint *)pM >> 0x1e & 1) == 0) {
      iVar3 = Nf_ObjCutSetId(p,i);
      if (iVar3 == 0) {
        p_local = (Nf_Man_t *)0x0;
      }
      else {
        piVar5 = Nf_ObjCutSet(p,i);
        piVar5 = Nf_CutFromHandle(piVar5,*(uint *)pM >> 0x14 & 0x3ff);
        fCompl = 0;
        while( true ) {
          iVar3 = Nf_CutSize(piVar5);
          bVar1 = false;
          if (fCompl < iVar3) {
            piVar6 = Nf_CutLeaves(piVar5);
            iVar3 = Nf_CfgVar(pM->Cfg,fCompl);
            pCut._4_4_ = piVar6[iVar3];
            bVar1 = false;
            if (pCut._4_4_ != 0) {
              pCut._0_4_ = Nf_CfgCompl(pM->Cfg,fCompl);
              bVar1 = true;
            }
          }
          if (!bVar1) break;
          pMVar8 = Nf_ManCell(p,*(uint *)pM & 0xfffff);
          iVar3 = pMVar8->iDelays[fCompl];
          if (vBackup != (Vec_Int_t *)0x0) {
            iVar2 = Abc_Var2Lit(pCut._4_4_,(int)pCut);
            Vec_IntPush(vBackup,iVar2);
          }
          iVar2 = Nf_ObjMapRefNum(p,pCut._4_4_,(int)pCut);
          if (iVar2 < 0) {
            __assert_fail("Nf_ObjMapRefNum(p, iVar, fCompl) >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                          ,0x6cd,
                          "word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, int, Vec_Int_t *)"
                         );
          }
          iVar2 = Nf_ObjMapRefInc(p,pCut._4_4_,(int)pCut);
          if (iVar2 == 0) {
            pNVar4 = Nf_ObjMatchD(p,pCut._4_4_,(int)pCut);
            wVar7 = Nf_MatchRef_rec(p,pCut._4_4_,(int)pCut,pNVar4,Required - iVar3,vBackup);
            _k = wVar7 + _k;
          }
          fCompl = fCompl + 1;
        }
        pMVar8 = Nf_ManCell(p,*(uint *)pM & 0xfffff);
        p_local = (Nf_Man_t *)(_k + pMVar8->AreaW);
      }
    }
    else {
      iVar3 = p->InvDelayI;
      if (vBackup != (Vec_Int_t *)0x0) {
        iVar2 = Abc_Var2Lit(i,(uint)((c != 0 ^ 0xffU) & 1));
        Vec_IntPush(vBackup,iVar2);
      }
      iVar2 = Nf_ObjMapRefNum(p,i,(uint)((c != 0 ^ 0xffU) & 1));
      if (iVar2 < 0) {
        __assert_fail("Nf_ObjMapRefNum(p, i, !c) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                      ,0x6c0,
                      "word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, int, Vec_Int_t *)");
      }
      iVar2 = Nf_ObjMapRefInc(p,i,(uint)((c != 0 ^ 0xffU) & 1));
      if (iVar2 == 0) {
        pNVar4 = Nf_ObjMatchD(p,i,(uint)((c != 0 ^ 0xffU) & 1));
        _k = Nf_MatchRef_rec(p,i,(uint)((c != 0 ^ 0xffU) & 1),pNVar4,Required - iVar3,vBackup);
      }
      p_local = (Nf_Man_t *)(_k + p->InvAreaW);
    }
    return (word)p_local;
  }
  __assert_fail("pM->D <= Required",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                ,0x6ba,"word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, int, Vec_Int_t *)");
}

Assistant:

word Nf_MatchRef_rec( Nf_Man_t * p, int i, int c, Nf_Mat_t * pM, int Required, Vec_Int_t * vBackup )
{
    word Area = 0;
    int ReqFanin;
    int k, iVar, fCompl, * pCut;
    assert( pM->fBest );
    assert( pM->D <= Required );
    if ( pM->fCompl )
    {
        ReqFanin = Required - p->InvDelayI;
        if ( vBackup )
            Vec_IntPush( vBackup, Abc_Var2Lit(i, !c) );
        assert( Nf_ObjMapRefNum(p, i, !c) >= 0 );
        if ( !Nf_ObjMapRefInc(p, i, !c) )
            Area += Nf_MatchRef_rec( p, i, !c, Nf_ObjMatchD(p, i, !c), ReqFanin, vBackup );
        return Area + p->InvAreaW;
    }
    if ( Nf_ObjCutSetId(p, i) == 0 )
        return 0;
    pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pM->CutH );
    Nf_CutForEachVarCompl( pCut, pM->Cfg, iVar, fCompl, k )
    {
        ReqFanin = Required - Nf_ManCell(p, pM->Gate)->iDelays[k];
        if ( vBackup )
            Vec_IntPush( vBackup, Abc_Var2Lit(iVar, fCompl) );
        assert( Nf_ObjMapRefNum(p, iVar, fCompl) >= 0 );
        if ( !Nf_ObjMapRefInc(p, iVar, fCompl) )
            Area += Nf_MatchRef_rec( p, iVar, fCompl, Nf_ObjMatchD(p, iVar, fCompl), ReqFanin, vBackup );
    }
    return Area + Nf_ManCell(p, pM->Gate)->AreaW;
}